

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_finishOp(lua_State *L)

{
  Instruction **ppIVar1;
  Value *pVVar2;
  uint uVar3;
  CallInfo *pCVar4;
  StkId pTVar5;
  Value VVar6;
  undefined4 uVar7;
  StkId pTVar8;
  int iVar9;
  bool bVar10;
  
  pCVar4 = L->ci;
  uVar3 = *(uint *)((pCVar4->u).c.old_errfunc + -4);
  if (0x23 < (uVar3 & 0x3f) - 6) {
    return;
  }
  pTVar8 = (pCVar4->u).l.base;
  switch(uVar3 & 0x3f) {
  default:
    pTVar5 = L->top;
    L->top = pTVar5 + -1;
    VVar6 = *(Value *)&pTVar5[-1].tt_;
    pVVar2 = (Value *)((long)&pTVar8->value_ + (ulong)(uVar3 >> 2 & 0xff0));
    *pVVar2 = pTVar5[-1].value_;
    pVVar2[1] = VVar6;
    return;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0x1b:
  case 0x1e:
  case 0x22:
  case 0x23:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
    goto switchD_0011c417_caseD_8;
  case 0x1d:
    pTVar5 = L->top;
    iVar9 = pTVar5[-1].tt_;
    uVar7 = *(undefined4 *)&pTVar5[-1].field_0xc;
    pTVar5[-3].value_ = pTVar5[-1].value_;
    pTVar5[-3].tt_ = iVar9;
    *(undefined4 *)&pTVar5[-3].field_0xc = uVar7;
    iVar9 = (int)((ulong)((long)pTVar5 + (-0x20 - (long)(pTVar8 + (uVar3 >> 0x17)))) >> 4);
    if (1 < iVar9) {
      L->top = pTVar5 + -2;
      luaV_concat(L,iVar9);
    }
    VVar6 = *(Value *)&L->top[-1].tt_;
    pVVar2 = (Value *)((long)&((pCVar4->u).l.base)->value_ + (ulong)(uVar3 >> 2 & 0xff0));
    *pVVar2 = L->top[-1].value_;
    pVVar2[1] = VVar6;
    break;
  case 0x1f:
  case 0x20:
  case 0x21:
    iVar9 = L->top[-1].tt_;
    pTVar8 = L->top + -1;
    if (iVar9 == 0) {
      bVar10 = true;
    }
    else if (iVar9 == 1) {
      bVar10 = (pTVar8->value_).b == 0;
    }
    else {
      bVar10 = false;
    }
    L->top = pTVar8;
    if ((char)pCVar4->callstatus < '\0') {
      pCVar4->callstatus = pCVar4->callstatus & 0xff7f;
    }
    else {
      bVar10 = (bool)(bVar10 ^ 1);
    }
    if ((uVar3 >> 6 & 0xff) == (uint)bVar10) {
      return;
    }
    ppIVar1 = &(pCVar4->u).l.savedpc;
    *ppIVar1 = *ppIVar1 + 1;
    return;
  case 0x24:
    if ((uVar3 & 0x7fc000) == 0) {
      return;
    }
    break;
  case 0x29:
    break;
  }
  L->top = pCVar4->top;
switchD_0011c417_caseD_8:
  return;
}

Assistant:

void luaV_finishOp(lua_State *L) {
    CallInfo *ci = L->ci;
    StkId base = ci->u.l.base;
    Instruction inst = *(ci->u.l.savedpc - 1);  /* interrupted instruction */
    OpCode op = GET_OPCODE(inst);
    switch (op) {  /* finish its execution */
        case OP_ADD:
        case OP_SUB:
        case OP_MUL:
        case OP_DIV:
        case OP_IDIV:
        case OP_BAND:
        case OP_BOR:
        case OP_BXOR:
        case OP_SHL:
        case OP_SHR:
        case OP_MOD:
        case OP_POW:
        case OP_UNM:
        case OP_BNOT:
        case OP_LEN:
        case OP_GETTABUP:
        case OP_GETTABLE:
        case OP_SELF: {
            setobjs2s(L, base + GETARG_A(inst), --L->top);
            break;
        }
        case OP_LE:
        case OP_LT:
        case OP_EQ: {
            int res = !l_isfalse(L->top - 1);
            L->top--;
            if (ci->callstatus & CIST_LEQ) {  /* "<=" using "<" instead? */
                lua_assert(op == OP_LE);
                ci->callstatus ^= CIST_LEQ;  /* clear mark */
                res = !res;  /* negate result */
            }
            lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_JMP);
            if (res != GETARG_A(inst))  /* condition failed? */
                ci->u.l.savedpc++;  /* skip jump instruction */
            break;
        }
        case OP_CONCAT: {
            StkId top = L->top - 1;  /* top when 'luaT_trybinTM' was called */
            int b = GETARG_B(inst);      /* first element to concatenate */
            int total = cast_int(top - 1 - (base + b));  /* yet to concatenate */
            setobj2s(L, top - 2, top);  /* put TM result in proper position */
            if (total > 1) {  /* are there elements to concat? */
                L->top = top - 1;  /* top is one after last element (at top-2) */
                luaV_concat(L, total);  /* concat them (may yield again) */
            }
            /* move final result to final position */
            setobj2s(L, ci->u.l.base + GETARG_A(inst), L->top - 1);
            L->top = ci->top;  /* restore top */
            break;
        }
        case OP_TFORCALL: {
            lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_TFORLOOP);
            L->top = ci->top;  /* correct top */
            break;
        }
        case OP_CALL: {
            if (GETARG_C(inst) - 1 >= 0)  /* nresults >= 0? */
                L->top = ci->top;  /* adjust results */
            break;
        }
        case OP_TAILCALL:
        case OP_SETTABUP:
        case OP_SETTABLE:
            break;
        default:
            lua_assert(0);
    }
}